

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

bool __thiscall
Rml::ElementAnimation::InternalAddKey
          (ElementAnimation *this,float time,Property *in_property,Element *element,Tween tween)

{
  byte bVar1;
  Unit UVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  pointer pAVar6;
  Transform *pTVar7;
  pointer pTVar8;
  code *pcVar9;
  Transform *pTVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  pointer pTVar18;
  pointer puVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  PrimitiveList *__range2;
  Transform *pTVar25;
  ulong uVar26;
  Type *pTVar27;
  TransformPrimitive *pTVar28;
  ulong uVar29;
  TransformPrimitive *primitive;
  pointer pAVar30;
  long lVar31;
  Vector<AnimationKey> *this_00;
  long lVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  byte bVar36;
  size_t i_big;
  Vector<size_t> matching_indices;
  Vector<bool> dirty_list;
  ulong local_158;
  unsigned_long local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  Property *local_118;
  Vector<AnimationKey> *local_110;
  ulong local_108;
  Transform *local_100;
  Element *local_f8;
  float local_ec;
  vector<bool,_std::allocator<bool>_> local_e8;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [3];
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong *local_50;
  ulong local_48;
  Tween local_40;
  
  local_40.callback = tween.callback;
  local_40._0_8_ = tween._0_8_;
  bVar36 = 0;
  local_f8 = element;
  local_ec = time;
  if ((in_property->unit & (FILTER|DECORATOR|TRANSFORM|ANGLE|NUMBER_LENGTH_PERCENT|COLOUR|KEYWORD))
      == UNKNOWN) {
    pcVar24 = "Property value does not";
    if (in_property->unit == BOXSHADOWLIST) {
      pcVar24 = "Box shadows do not";
    }
    Property::ToString_abi_cxx11_((String *)local_c0,in_property);
    Log::Message(LT_WARNING,"%s support animations or transitions. Value: %s",pcVar24,local_c0._0_8_
                );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  this_00 = &this->keys;
  ::std::vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>>::
  emplace_back<float&,Rml::Property_const&,Rml::Tween&>
            ((vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>> *)this_00,&local_ec,
             in_property,&local_40);
  pAVar6 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  UVar2 = pAVar6[-1].property.unit;
  bVar11 = true;
  if (UVar2 == FILTER) {
    if ((pAVar6[-1].property.value.type != FILTERSPTR) &&
       (bVar12 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::FILTERSPTR)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                        ,0x27f), !bVar12)) {
LAB_002232f9:
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    if (*(long *)pAVar6[-1].property.value.data != 0) goto LAB_00223289;
    local_c0._0_8_ = (element_type *)0x0;
    local_c0._8_8_ = operator_new(0x48);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00335780;
    local_c0._0_8_ = local_c0._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_use_count =
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count = 0;
    Variant::operator=(&pAVar6[-1].property.value,(shared_ptr<Rml::FilterDeclarationList> *)local_c0
                      );
  }
  else {
    if (UVar2 != DECORATOR) {
      if (UVar2 == TRANSFORM) {
        pAVar30 = (this_00->
                  super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        iVar16 = (int)((ulong)((long)pAVar6 - (long)pAVar30) >> 3) * -0x3b13b13b;
        local_108 = (ulong)(iVar16 - 1U);
        lVar32 = (long)(int)(iVar16 - 1U);
        bVar1 = 1;
        local_118 = in_property;
        local_110 = this_00;
        do {
          if ((pAVar30[lVar32].property.value.type != TRANSFORMPTR) &&
             (bVar11 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::TRANSFORMPTR)",
                              "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                              ,0x227), !bVar11)) goto LAB_002232f9;
          if (*(long *)pAVar30[lVar32].property.value.data == 0) {
            local_c0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Rml::Transform,std::allocator<Rml::Transform>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8),
                       (Transform **)local_c0,(allocator<Rml::Transform> *)&local_e8);
            Variant::Clear(&pAVar30[lVar32].property.value);
            Variant::Set(&pAVar30[lVar32].property.value,(TransformPtr *)local_c0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
            }
          }
          pTVar7 = *(Transform **)pAVar30[lVar32].property.value.data;
          pTVar18 = (pTVar7->primitives).
                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar8 = (pTVar7->primitives).
                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pTVar18 != pTVar8) {
            bVar11 = false;
            do {
              bVar12 = TransformUtilities::PrepareForInterpolation(pTVar18,local_f8);
              if (!bVar12) {
                bVar11 = true;
                break;
              }
              pTVar18 = pTVar18 + 1;
            } while (pTVar18 != pTVar8);
            if (bVar11) {
              bVar11 = CombineAndDecompose(pTVar7,local_f8);
              bVar1 = bVar1 & bVar11;
            }
          }
          this_00 = local_110;
          in_property = local_118;
          lVar32 = lVar32 + 1;
          pAVar30 = (this->keys).
                    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar34 = (long)(this->keys).
                         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pAVar30 >> 3;
          uVar35 = lVar34 * 0x4ec4ec4ec4ec4ec5;
          iVar33 = (int)uVar35;
        } while (lVar32 < iVar33);
        if (bVar1 == 0) {
          bVar11 = false;
        }
        else {
          bVar11 = true;
          if ((1 < iVar16) && (1 < uVar35)) {
            local_c0._0_8_ = local_c0._0_8_ & 0xffffffffffffff00;
            ::std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_e8,(long)(iVar33 + 1),(bool *)local_c0,(allocator_type *)&local_138);
            local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_108 >> 6 & 0x3ffffff] =
                 local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [local_108 >> 6 & 0x3ffffff] | 1L << ((byte)local_108 & 0x3f);
            bVar11 = -1 < iVar33;
            bVar12 = iVar16 <= iVar33 && bVar11;
            if (iVar16 <= iVar33 && bVar11) {
              iVar16 = -1;
              bVar12 = true;
              bVar11 = true;
              uVar35 = local_108;
              do {
                local_58 = 1L << ((byte)uVar35 & 0x3f);
                uVar23 = uVar35 >> 6 & 0x3ffffff;
                if ((local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar23] >>
                     (uVar35 & 0x3f) & 1) == 0) {
                  uVar35 = (ulong)((int)uVar35 + 1);
                }
                else {
                  local_60 = (ulong)((int)uVar35 - 1);
                  pAVar6 = (this_00->
                           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  bVar15 = false;
                  local_68 = uVar23;
                  if ((pAVar6[local_60].property.unit == TRANSFORM) &&
                     (pAVar6[uVar35 & 0xffffffff].property.unit == TRANSFORM)) {
                    pTVar7 = *(Transform **)((long)&pAVar6[local_60].property.value + 8);
                    local_100 = *(Transform **)
                                 ((long)&pAVar6[uVar35 & 0xffffffff].property.value + 8);
                    pTVar18 = (pTVar7->primitives).
                              super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pTVar8 = (pTVar7->primitives).
                             super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    local_158 = (long)pTVar8 - (long)pTVar18;
                    if (local_158 ==
                        (long)(local_100->primitives).
                              super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_100->primitives).
                              super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start) {
                      local_108 = uVar35;
                      if (pTVar8 == pTVar18) {
                        local_158 = 0;
                        bVar15 = true;
                      }
                      else {
                        bVar15 = true;
                        lVar32 = 0;
                        local_158 = 0;
                        uVar35 = 0;
                        do {
                          pTVar10 = local_100;
                          iVar3 = *(int *)((long)&pTVar18->type + lVar32);
                          pTVar8 = (local_100->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          iVar4 = *(int *)((long)&pTVar8->type + lVar32);
                          bVar13 = TransformUtilities::TryConvertToMatchingGenericType
                                             ((TransformPrimitive *)((long)&pTVar18->type + lVar32),
                                              (TransformPrimitive *)((long)&pTVar8->type + lVar32));
                          if (bVar13) {
                            local_158._0_4_ =
                                 (uint)local_158 |
                                 *(int *)((long)&((pTVar7->primitives).
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                         lVar32) != iVar3;
                            if (*(int *)((long)&((pTVar10->primitives).
                                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->type +
                                        lVar32) != iVar4) {
                              local_158._0_4_ = (uint)local_158 | 2;
                            }
                            local_158 = (ulong)(uint)local_158;
                          }
                          else {
                            bVar15 = false;
                          }
                          this_00 = local_110;
                          in_property = local_118;
                          if (!bVar13) break;
                          uVar35 = uVar35 + 1;
                          pTVar18 = (pTVar7->primitives).
                                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          lVar32 = lVar32 + 0x48;
                        } while (uVar35 < (ulong)(((long)(pTVar7->primitives).
                                                                                                                  
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)pTVar18 >> 3) * -0x71c71c71c71c71c7));
                      }
                      uVar17 = (uint)local_158;
                      uVar35 = local_108;
                      if (!bVar15) goto LAB_00222c1b;
                    }
                    else {
LAB_00222c1b:
                      uVar23 = ((long)(pTVar7->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pTVar7->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x71c71c71c71c71c7;
                      lVar32 = (long)(local_100->primitives).
                                     super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_100->primitives).
                                     super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3;
                      uVar26 = lVar32 * -0x71c71c71c71c71c7;
                      if (uVar23 + lVar32 * 0x71c71c71c71c71c7 != 0) {
                        pTVar25 = pTVar7;
                        pTVar10 = local_100;
                        if (uVar23 < uVar26) {
                          pTVar25 = local_100;
                          pTVar10 = pTVar7;
                        }
                        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start = (ulong *)0x0;
                        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
                        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
                        local_108 = uVar35;
                        local_78 = uVar26;
                        local_70 = uVar23;
                        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                                  (&local_138,
                                   ((long)(pTVar10->primitives).
                                          super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pTVar10->primitives).
                                          super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x71c71c71c71c71c7 + 1);
                        local_140 = 0;
                        if ((pTVar10->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_finish ==
                            (pTVar10->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                          bVar13 = true;
                          bVar15 = false;
                        }
                        else {
                          uVar35 = 0;
                          bVar15 = false;
                          do {
                            pTVar18 = (pTVar25->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            if (local_140 <
                                (ulong)(((long)(pTVar25->primitives).
                                               super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pTVar18 >> 3) * -0x71c71c71c71c71c7)) {
                              bVar13 = false;
                              do {
                                TVar5 = pTVar18[local_140].type;
                                bVar14 = TransformUtilities::TryConvertToMatchingGenericType
                                                   ((pTVar10->primitives).
                                                                                                        
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar35
                                                  ,pTVar18 + local_140);
                                if (bVar14) {
                                  if ((pTVar25->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start[local_140].type !=
                                      TVar5) {
                                    bVar15 = true;
                                  }
                                  if (local_138.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish ==
                                      local_138.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                                    _M_realloc_insert<unsigned_long_const&>
                                              ((vector<unsigned_long,std::allocator<unsigned_long>>
                                                *)&local_138,
                                               (iterator)
                                               local_138.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_finish,&local_140
                                              );
                                  }
                                  else {
                                    *local_138.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish = local_140;
                                    local_138.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish =
                                         local_138.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                                  }
                                  local_140 = local_140 + 1;
                                  bVar13 = true;
                                }
                                if (bVar14) break;
                                local_140 = local_140 + 1;
                                pTVar18 = (pTVar25->primitives).
                                          super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                              } while (local_140 <
                                       (ulong)(((long)(pTVar25->primitives).
                                                                                                            
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)pTVar18 >> 3) * -0x71c71c71c71c71c7));
                            }
                            else {
                              bVar13 = false;
                            }
                            this_00 = local_110;
                            in_property = local_118;
                          } while ((bVar13) &&
                                  (uVar35 = uVar35 + 1,
                                  uVar35 < (ulong)(((long)(pTVar10->primitives).
                                                                                                                    
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pTVar10->primitives).
                                                                                                                
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                  -0x71c71c71c71c71c7)));
                        }
                        uVar17 = (uint)local_158;
                        if (bVar13) {
                          local_c0._0_8_ =
                               ((long)(pTVar25->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pTVar25->primitives).
                                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x71c71c71c71c71c7;
                          if (local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                            _M_realloc_insert<unsigned_long>
                                      (&local_138,
                                       (iterator)
                                       local_138.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                       (unsigned_long *)local_c0);
                          }
                          else {
                            *local_138.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish = local_c0._0_8_;
                            local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish =
                                 local_138.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          ::std::
                          vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                          ::reserve(&pTVar10->primitives,
                                    ((long)(pTVar25->primitives).
                                           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pTVar25->primitives).
                                           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                    -0x71c71c71c71c71c7);
                          local_50 = local_138.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                          if (local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start !=
                              local_138.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                            uVar35 = 0;
                            puVar19 = local_138.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            do {
                              local_48 = *puVar19;
                              lVar32 = local_48 - uVar35;
                              if (uVar35 <= local_48 && lVar32 != 0) {
                                lVar31 = uVar35 * 0x48;
                                do {
                                  pTVar27 = (Type *)((long)&((pTVar25->primitives).
                                                                                                                          
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                                  lVar31);
                                  pTVar28 = (TransformPrimitive *)local_c0;
                                  for (lVar20 = 0x12; lVar20 != 0; lVar20 = lVar20 + -1) {
                                    pTVar28->type = *pTVar27;
                                    pTVar27 = pTVar27 + (ulong)bVar36 * -2 + 1;
                                    pTVar28 = (TransformPrimitive *)
                                              ((long)pTVar28 + (ulong)bVar36 * -8 + 4);
                                  }
                                  TransformUtilities::SetIdentity((TransformPrimitive *)local_c0);
                                  ::std::
                                  vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                  ::insert(&pTVar10->primitives,
                                           (TransformPrimitive *)
                                           ((long)&((pTVar10->primitives).
                                                                                                        
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                           lVar31),(TransformPrimitive *)local_c0);
                                  lVar31 = lVar31 + 0x48;
                                  lVar32 = lVar32 + -1;
                                } while (lVar32 != 0);
                              }
                              uVar35 = local_48 + 1;
                              puVar19 = puVar19 + 1;
                            } while (puVar19 != local_50);
                          }
                          this_00 = local_110;
                          in_property = local_118;
                          uVar17 = 2 - (local_70 < local_78);
                          if (bVar15) {
                            uVar17 = 3;
                          }
                        }
                        if (local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (ulong *)0x0) {
                          operator_delete(local_138.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_138.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_138.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        uVar35 = local_108;
                        if (bVar13) goto LAB_00222f95;
                      }
                      bVar15 = CombineAndDecompose(pTVar7,local_f8);
                      uVar17 = 4;
                      if (bVar15) {
                        bVar15 = CombineAndDecompose(local_100,local_f8);
                        uVar17 = 4 - bVar15;
                      }
                    }
LAB_00222f95:
                    bVar15 = uVar17 != 4;
                    if (bVar15) {
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_68] =
                           local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_68]
                           & ~local_58;
                      uVar21 = local_60 >> 6 & 0x3ffffff;
                      uVar23 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar21];
                      uVar29 = uVar23 | 1L << (local_60 & 0x3f);
                      uVar26 = uVar23 & ~(1L << (local_60 & 0x3f));
                      if ((uVar23 >> (local_60 & 0x3f) & 1) != 0) {
                        uVar26 = uVar29;
                      }
                      iVar3 = (int)uVar35;
                      uVar22 = iVar3 + 1;
                      uVar23 = (ulong)uVar22;
                      bVar15 = (uVar17 & 1) != 0;
                      if (bVar15) {
                        uVar26 = uVar29;
                      }
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar21] =
                           uVar26;
                      uVar26 = local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               [uVar22 >> 6];
                      uVar35 = (ulong)uVar22;
                      if (bVar15) {
                        uVar35 = local_60 & 0xffffffff;
                      }
                      uVar29 = uVar26 | 1L << (uVar23 & 0x3f);
                      uVar21 = uVar26 & ~(1L << (uVar23 & 0x3f));
                      if ((uVar26 >> (uVar23 & 0x3f) & 1) != 0) {
                        uVar21 = uVar29;
                      }
                      if ((uVar17 & 2) != 0) {
                        uVar21 = uVar29;
                      }
                      local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar22 >> 6] =
                           uVar21;
                      if (iVar3 < 2) {
                        uVar35 = (ulong)uVar22;
                      }
                      bVar15 = true;
                    }
                  }
                  if (!bVar15) break;
                }
                iVar16 = iVar16 + 1;
                bVar11 = iVar16 < (int)lVar34 * 0x4ec4ec4f;
                bVar12 = (int)uVar35 < iVar33 && bVar11;
              } while (bVar12);
            }
            if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
              operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_end_of_storage -
                              (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
              ;
              local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
            }
            bVar11 = (bool)((bVar12 ^ 1U) & bVar11);
          }
        }
      }
      goto LAB_00223289;
    }
    if ((pAVar6[-1].property.value.type != DECORATORSPTR) &&
       (bVar12 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::DECORATORSPTR)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                        ,0x277), !bVar12)) goto LAB_002232f9;
    if (*(long *)pAVar6[-1].property.value.data != 0) goto LAB_00223289;
    local_c0._0_8_ = (element_type *)0x0;
    local_c0._8_8_ = operator_new(0x48);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00335730;
    local_c0._0_8_ = local_c0._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x10))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x20))->_M_use_count =
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c0._8_8_ + 0x30))->_M_use_count = 0;
    Variant::operator=(&pAVar6[-1].property.value,
                       (shared_ptr<Rml::DecoratorDeclarationList> *)local_c0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
LAB_00223289:
  if (bVar11 == false) {
    Property::ToString_abi_cxx11_((String *)local_c0,in_property);
    Log::Message(LT_WARNING,"Could not add animation key with property \'%s\'.",local_c0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ != local_b0) {
      operator_delete((void *)local_c0._0_8_,local_b0[0]._M_allocated_capacity + 1);
    }
    ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::pop_back(this_00);
  }
  return bVar11;
}

Assistant:

bool ElementAnimation::InternalAddKey(float time, const Property& in_property, Element& element, Tween tween)
{
	const Units valid_units =
		(Unit::NUMBER_LENGTH_PERCENT | Unit::ANGLE | Unit::COLOUR | Unit::TRANSFORM | Unit::KEYWORD | Unit::DECORATOR | Unit::FILTER);

	if (!Any(in_property.unit & valid_units))
	{
		const char* property_type = (in_property.unit == Unit::BOXSHADOWLIST ? "Box shadows do not" : "Property value does not");
		Log::Message(Log::LT_WARNING, "%s support animations or transitions. Value: %s", property_type, in_property.ToString().c_str());
		return false;
	}

	keys.emplace_back(time, in_property, tween);
	Property& property = keys.back().property;
	bool result = true;

	if (property.unit == Unit::TRANSFORM)
	{
		result = PrepareTransforms(keys, element, (int)keys.size() - 1);
	}
	else if (property.unit == Unit::DECORATOR)
	{
		PrepareDecorator(keys.back());
	}
	else if (property.unit == Unit::FILTER)
	{
		PrepareFilter(keys.back());
	}

	if (!result)
	{
		Log::Message(Log::LT_WARNING, "Could not add animation key with property '%s'.", in_property.ToString().c_str());
		keys.pop_back();
	}

	return result;
}